

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_componentEqualDifferentOrderComponents_Test::TestBody
          (Equality_componentEqualDifferentOrderComponents_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ComponentPtr c2;
  ComponentPtr c1;
  ComponentPtr cChild6;
  ComponentPtr cChild5;
  ComponentPtr cChild4;
  ComponentPtr cChild3;
  ComponentPtr cChild2;
  ComponentPtr cChild1;
  AssertionResult local_d0;
  long local_c0 [2];
  long *local_b0;
  AssertHelper local_a8 [8];
  byte local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  shared_ptr *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  shared_ptr *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"c","");
  libcellml::Component::create((string *)&local_80);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"c","");
  libcellml::Component::create((string *)&local_90);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child1","");
  libcellml::Component::create(local_20);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child2","");
  libcellml::Component::create(local_30);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child3","");
  libcellml::Component::create(local_40);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child1","");
  libcellml::Component::create(local_50);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child2","");
  libcellml::Component::create(local_60);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  local_d0._0_8_ = (shared_ptr *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"child3","");
  libcellml::Component::create(local_70);
  if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
  }
  libcellml::ComponentEntity::addComponent(local_80);
  libcellml::ComponentEntity::addComponent(local_80);
  libcellml::ComponentEntity::addComponent(local_80);
  libcellml::ComponentEntity::addComponent(local_90);
  libcellml::ComponentEntity::addComponent(local_90);
  libcellml::ComponentEntity::addComponent(local_90);
  local_d0._0_8_ = local_90;
  local_d0.message_.ptr_ = local_88;
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_88->_M_string_length = (int)local_88->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_88->_M_string_length = (int)local_88->_M_string_length + 1;
    }
  }
  local_a0[0] = libcellml::Entity::equals(local_80);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_a0[0];
  if (local_d0.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0.message_.ptr_);
    bVar1 = local_a0[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(char *)local_a0,"c1->equals(c2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2ab,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
      operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
    }
    if (((local_b0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b0 != (long *)0x0)) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0._0_8_ = local_80;
  local_d0.message_.ptr_ = local_78;
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_78->_M_string_length = (int)local_78->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_78->_M_string_length = (int)local_78->_M_string_length + 1;
    }
  }
  local_a0[0] = libcellml::Entity::equals(local_90);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_a0[0];
  if (local_d0.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0.message_.ptr_);
    bVar1 = local_a0[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(char *)local_a0,"c2->equals(c1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2ac,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    if ((shared_ptr *)local_d0._0_8_ != (shared_ptr *)local_c0) {
      operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
    }
    if (((local_b0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b0 != (long *)0x0)) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88);
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}